

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O3

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createLoad(LLVMReadWriteGraphBuilder *this,Instruction *Inst)

{
  uint uVar1;
  SmallPtrSetImpl *Ty;
  GenericDefSite<dg::dda::RWNode> *pGVar2;
  char cVar3;
  RWNode *pRVar4;
  DataLayout *this_00;
  Offset size;
  Instruction *pIVar5;
  GenericDefSite<dg::dda::RWNode> *ds;
  pointer __v;
  TypeSize TVar6;
  vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  defSites;
  vector<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  local_40;
  
  pRVar4 = ReadWriteGraph::create(&this->graph,LOAD);
  Ty = *(SmallPtrSetImpl **)Inst;
  this_00 = (DataLayout *)llvm::Module::getDataLayout();
  uVar1 = *(uint *)(Ty + 8);
  if ((byte)uVar1 < 0x12) {
    if ((0xac7fU >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0x30000U >> (uVar1 & 0x1f) & 1) == 0) goto LAB_00110e65;
      goto LAB_00110e4e;
    }
LAB_00110d94:
    TVar6 = llvm::DataLayout::getTypeAllocSize(this_00,(Type *)Ty);
    local_40.
    super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         TVar6.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
         Value;
    local_40.
    super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
         TVar6.super_LinearPolySize<llvm::TypeSize>.super_UnivariateLinearPolyBase<llvm::TypeSize>.
         UnivariateDim;
    size.offset = llvm::TypeSize::operator_cast_to_unsigned_long((TypeSize *)&local_40);
    if (size.offset != 0) goto LAB_00110dc1;
  }
  else {
LAB_00110e65:
    if ((uVar1 & 0xfe) == 0x12) {
LAB_00110e4e:
      cVar3 = llvm::Type::isSizedDerivedType(Ty);
      if (cVar3 != '\0') goto LAB_00110d94;
    }
  }
  size.offset = Offset::UNKNOWN;
LAB_00110dc1:
  if ((*(uint *)(Inst + 0x14) >> 0x1e & 1) == 0) {
    pIVar5 = Inst + -(ulong)(*(uint *)(Inst + 0x14) << 5);
  }
  else {
    pIVar5 = *(Instruction **)(Inst + -8);
  }
  mapPointers(&local_40,this,(Value *)Inst,*(Value **)pIVar5,size);
  pGVar2 = (GenericDefSite<dg::dda::RWNode> *)
           CONCAT44(local_40.
                    super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                    (uint)local_40.
                          super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  if (local_40.
      super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pGVar2) {
    __v = local_40.
          super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::
      _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
      ::_M_insert_unique<dg::dda::GenericDefSite<dg::dda::RWNode>const&>
                ((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                  *)&(pRVar4->annotations).uses,__v);
      __v = __v + 1;
    } while (__v != pGVar2);
  }
  if (local_40.
      super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (GenericDefSite<dg::dda::RWNode> *)0x0) {
    operator_delete(local_40.
                    super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<dg::dda::GenericDefSite<dg::dda::RWNode>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pRVar4;
}

Assistant:

RWNode *LLVMReadWriteGraphBuilder::createLoad(const llvm::Instruction *Inst) {
    RWNode &node = create(RWNodeType::LOAD);

    uint64_t size =
            llvmutils::getAllocatedSize(Inst->getType(), getDataLayout());
    if (size == 0)
        size = Offset::UNKNOWN;

    auto defSites = mapPointers(Inst, Inst->getOperand(0), size);
    for (const auto &ds : defSites) {
        node.addUse(ds);
    }

    return &node;
}